

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_fracWeight(U32 rawStat)

{
  U32 UVar1;
  U32 weight;
  U32 FWeight;
  U32 BWeight;
  U32 hb;
  U32 stat;
  U32 rawStat_local;
  
  UVar1 = ZSTD_highbit32(rawStat + 1);
  if (UVar1 + 8 < 0x1f) {
    return UVar1 * 0x100 + ((rawStat + 1) * 0x100 >> ((byte)UVar1 & 0x1f));
  }
  __assert_fail("hb + BITCOST_ACCURACY < 31",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x45cb,"U32 ZSTD_fracWeight(U32)");
}

Assistant:

MEM_STATIC U32 ZSTD_fracWeight(U32 rawStat)
{
    U32 const stat = rawStat + 1;
    U32 const hb = ZSTD_highbit32(stat);
    U32 const BWeight = hb * BITCOST_MULTIPLIER;
    U32 const FWeight = (stat << BITCOST_ACCURACY) >> hb;
    U32 const weight = BWeight + FWeight;
    assert(hb + BITCOST_ACCURACY < 31);
    return weight;
}